

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlIsNameChar(xmlParserCtxtPtr ctxt,int c)

{
  int iVar1;
  int c_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->options & 0x20000U) == 0) {
    if (c == 0x20) {
      return 0;
    }
    if (c == 0x3e) {
      return 0;
    }
    if (c == 0x2f) {
      return 0;
    }
    if (((((((c < 0x61) || (0x7a < c)) && ((c < 0x41 || (0x5a < c)))) &&
          ((((c < 0x30 || (0x39 < c)) && (c != 0x5f)) && ((c != 0x3a && (c != 0x2d)))))) &&
         ((c != 0x2e && ((c != 0xb7 && ((c < 0xc0 || (0xd6 < c)))))))) &&
        (((c < 0xd8 || (0xf6 < c)) &&
         (((((c < 0xf8 || (0x2ff < c)) && ((c < 0x300 || (0x36f < c)))) &&
           (((c < 0x370 || (0x37d < c)) && ((c < 0x37f || (0x1fff < c)))))) &&
          ((((c < 0x200c || (0x200d < c)) && ((c < 0x203f || (0x2040 < c)))) &&
           ((c < 0x2070 || (0x218f < c)))))))))) &&
       (((c < 0x2c00 || (0x2fef < c)) &&
        ((((c < 0x3001 || (0xd7ff < c)) && ((c < 0xf900 || (0xfdcf < c)))) &&
         ((c < 0xfdf0 || (0xfffd < c)))))))) {
      if (c < 0x10000) {
        return 0;
      }
      if (0xeffff < c) {
        return 0;
      }
    }
    return 1;
  }
  if (c < 0x100) {
    if ((0x40 < c) && (c < 0x5b)) {
      return 1;
    }
    if ((0x60 < c) && (c < 0x7b)) {
      return 1;
    }
    if ((0xbf < c) && (c < 0xd7)) {
      return 1;
    }
    if ((0xd7 < c) && (c < 0xf7)) {
      return 1;
    }
    if (0xf7 < c) {
      return 1;
    }
  }
  else {
    iVar1 = xmlCharInRange(c,&xmlIsBaseCharGroup);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if ((c < 0x100) ||
     ((((c < 0x4e00 || (0x9fa5 < c)) && (c != 0x3007)) && ((c < 0x3021 || (0x3029 < c)))))) {
    if (c < 0x100) {
      if ((0x2f < c) && (c < 0x3a)) {
        return 1;
      }
    }
    else {
      iVar1 = xmlCharInRange(c,&xmlIsDigitGroup);
      if (iVar1 != 0) {
        return 1;
      }
    }
    if ((((c != 0x2e) && (c != 0x2d)) && (c != 0x5f)) &&
       ((c != 0x3a && ((c < 0x100 || (iVar1 = xmlCharInRange(c,&xmlIsCombiningGroup), iVar1 == 0))))
       )) {
      if (c < 0x100) {
        if (c != 0xb7) {
          return 0;
        }
      }
      else {
        iVar1 = xmlCharInRange(c,&xmlIsExtenderGroup);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static int
xmlIsNameChar(xmlParserCtxtPtr ctxt, int c) {
    if ((ctxt->options & XML_PARSE_OLD10) == 0) {
        /*
	 * Use the new checks of production [4] [4a] amd [5] of the
	 * Update 5 of XML-1.0
	 */
	if ((c != ' ') && (c != '>') && (c != '/') && /* accelerators */
	    (((c >= 'a') && (c <= 'z')) ||
	     ((c >= 'A') && (c <= 'Z')) ||
	     ((c >= '0') && (c <= '9')) || /* !start */
	     (c == '_') || (c == ':') ||
	     (c == '-') || (c == '.') || (c == 0xB7) || /* !start */
	     ((c >= 0xC0) && (c <= 0xD6)) ||
	     ((c >= 0xD8) && (c <= 0xF6)) ||
	     ((c >= 0xF8) && (c <= 0x2FF)) ||
	     ((c >= 0x300) && (c <= 0x36F)) || /* !start */
	     ((c >= 0x370) && (c <= 0x37D)) ||
	     ((c >= 0x37F) && (c <= 0x1FFF)) ||
	     ((c >= 0x200C) && (c <= 0x200D)) ||
	     ((c >= 0x203F) && (c <= 0x2040)) || /* !start */
	     ((c >= 0x2070) && (c <= 0x218F)) ||
	     ((c >= 0x2C00) && (c <= 0x2FEF)) ||
	     ((c >= 0x3001) && (c <= 0xD7FF)) ||
	     ((c >= 0xF900) && (c <= 0xFDCF)) ||
	     ((c >= 0xFDF0) && (c <= 0xFFFD)) ||
	     ((c >= 0x10000) && (c <= 0xEFFFF))))
	     return(1);
    } else {
        if ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':') ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))
	    return(1);
    }
    return(0);
}